

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_LookupTable(LookupTableForm1 LookupTable)

{
  uint8_t uVar1;
  bool bVar2;
  pointer puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  Image local_60;
  Image local_38;
  
  Unit_Test::intensityArray(&local_90,2);
  Unit_Test::randomImage(&local_38,&local_90);
  puVar3 = (pointer)operator_new(0x100);
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + 0x100;
  puVar3[0xc0] = '\0';
  puVar3[0xc1] = '\0';
  puVar3[0xc2] = '\0';
  puVar3[0xc3] = '\0';
  puVar3[0xc4] = '\0';
  puVar3[0xc5] = '\0';
  puVar3[0xc6] = '\0';
  puVar3[199] = '\0';
  puVar3[200] = '\0';
  puVar3[0xc9] = '\0';
  puVar3[0xca] = '\0';
  puVar3[0xcb] = '\0';
  puVar3[0xcc] = '\0';
  puVar3[0xcd] = '\0';
  puVar3[0xce] = '\0';
  puVar3[0xcf] = '\0';
  puVar3[0xd0] = '\0';
  puVar3[0xd1] = '\0';
  puVar3[0xd2] = '\0';
  puVar3[0xd3] = '\0';
  puVar3[0xd4] = '\0';
  puVar3[0xd5] = '\0';
  puVar3[0xd6] = '\0';
  puVar3[0xd7] = '\0';
  puVar3[0xd8] = '\0';
  puVar3[0xd9] = '\0';
  puVar3[0xda] = '\0';
  puVar3[0xdb] = '\0';
  puVar3[0xdc] = '\0';
  puVar3[0xdd] = '\0';
  puVar3[0xde] = '\0';
  puVar3[0xdf] = '\0';
  puVar3[0xe0] = '\0';
  puVar3[0xe1] = '\0';
  puVar3[0xe2] = '\0';
  puVar3[0xe3] = '\0';
  puVar3[0xe4] = '\0';
  puVar3[0xe5] = '\0';
  puVar3[0xe6] = '\0';
  puVar3[0xe7] = '\0';
  puVar3[0xe8] = '\0';
  puVar3[0xe9] = '\0';
  puVar3[0xea] = '\0';
  puVar3[0xeb] = '\0';
  puVar3[0xec] = '\0';
  puVar3[0xed] = '\0';
  puVar3[0xee] = '\0';
  puVar3[0xef] = '\0';
  puVar3[0xf0] = '\0';
  puVar3[0xf1] = '\0';
  puVar3[0xf2] = '\0';
  puVar3[0xf3] = '\0';
  puVar3[0xf4] = '\0';
  puVar3[0xf5] = '\0';
  puVar3[0xf6] = '\0';
  puVar3[0xf7] = '\0';
  puVar3[0xf8] = '\0';
  puVar3[0xf9] = '\0';
  puVar3[0xfa] = '\0';
  puVar3[0xfb] = '\0';
  puVar3[0xfc] = '\0';
  puVar3[0xfd] = '\0';
  puVar3[0xfe] = '\0';
  puVar3[0xff] = '\0';
  puVar3[0x80] = '\0';
  puVar3[0x81] = '\0';
  puVar3[0x82] = '\0';
  puVar3[0x83] = '\0';
  puVar3[0x84] = '\0';
  puVar3[0x85] = '\0';
  puVar3[0x86] = '\0';
  puVar3[0x87] = '\0';
  puVar3[0x88] = '\0';
  puVar3[0x89] = '\0';
  puVar3[0x8a] = '\0';
  puVar3[0x8b] = '\0';
  puVar3[0x8c] = '\0';
  puVar3[0x8d] = '\0';
  puVar3[0x8e] = '\0';
  puVar3[0x8f] = '\0';
  puVar3[0x90] = '\0';
  puVar3[0x91] = '\0';
  puVar3[0x92] = '\0';
  puVar3[0x93] = '\0';
  puVar3[0x94] = '\0';
  puVar3[0x95] = '\0';
  puVar3[0x96] = '\0';
  puVar3[0x97] = '\0';
  puVar3[0x98] = '\0';
  puVar3[0x99] = '\0';
  puVar3[0x9a] = '\0';
  puVar3[0x9b] = '\0';
  puVar3[0x9c] = '\0';
  puVar3[0x9d] = '\0';
  puVar3[0x9e] = '\0';
  puVar3[0x9f] = '\0';
  puVar3[0xa0] = '\0';
  puVar3[0xa1] = '\0';
  puVar3[0xa2] = '\0';
  puVar3[0xa3] = '\0';
  puVar3[0xa4] = '\0';
  puVar3[0xa5] = '\0';
  puVar3[0xa6] = '\0';
  puVar3[0xa7] = '\0';
  puVar3[0xa8] = '\0';
  puVar3[0xa9] = '\0';
  puVar3[0xaa] = '\0';
  puVar3[0xab] = '\0';
  puVar3[0xac] = '\0';
  puVar3[0xad] = '\0';
  puVar3[0xae] = '\0';
  puVar3[0xaf] = '\0';
  puVar3[0xb0] = '\0';
  puVar3[0xb1] = '\0';
  puVar3[0xb2] = '\0';
  puVar3[0xb3] = '\0';
  puVar3[0xb4] = '\0';
  puVar3[0xb5] = '\0';
  puVar3[0xb6] = '\0';
  puVar3[0xb7] = '\0';
  puVar3[0xb8] = '\0';
  puVar3[0xb9] = '\0';
  puVar3[0xba] = '\0';
  puVar3[0xbb] = '\0';
  puVar3[0xbc] = '\0';
  puVar3[0xbd] = '\0';
  puVar3[0xbe] = '\0';
  puVar3[0xbf] = '\0';
  puVar3[0x40] = '\0';
  puVar3[0x41] = '\0';
  puVar3[0x42] = '\0';
  puVar3[0x43] = '\0';
  puVar3[0x44] = '\0';
  puVar3[0x45] = '\0';
  puVar3[0x46] = '\0';
  puVar3[0x47] = '\0';
  puVar3[0x48] = '\0';
  puVar3[0x49] = '\0';
  puVar3[0x4a] = '\0';
  puVar3[0x4b] = '\0';
  puVar3[0x4c] = '\0';
  puVar3[0x4d] = '\0';
  puVar3[0x4e] = '\0';
  puVar3[0x4f] = '\0';
  puVar3[0x50] = '\0';
  puVar3[0x51] = '\0';
  puVar3[0x52] = '\0';
  puVar3[0x53] = '\0';
  puVar3[0x54] = '\0';
  puVar3[0x55] = '\0';
  puVar3[0x56] = '\0';
  puVar3[0x57] = '\0';
  puVar3[0x58] = '\0';
  puVar3[0x59] = '\0';
  puVar3[0x5a] = '\0';
  puVar3[0x5b] = '\0';
  puVar3[0x5c] = '\0';
  puVar3[0x5d] = '\0';
  puVar3[0x5e] = '\0';
  puVar3[0x5f] = '\0';
  puVar3[0x60] = '\0';
  puVar3[0x61] = '\0';
  puVar3[0x62] = '\0';
  puVar3[99] = '\0';
  puVar3[100] = '\0';
  puVar3[0x65] = '\0';
  puVar3[0x66] = '\0';
  puVar3[0x67] = '\0';
  puVar3[0x68] = '\0';
  puVar3[0x69] = '\0';
  puVar3[0x6a] = '\0';
  puVar3[0x6b] = '\0';
  puVar3[0x6c] = '\0';
  puVar3[0x6d] = '\0';
  puVar3[0x6e] = '\0';
  puVar3[0x6f] = '\0';
  puVar3[0x70] = '\0';
  puVar3[0x71] = '\0';
  puVar3[0x72] = '\0';
  puVar3[0x73] = '\0';
  puVar3[0x74] = '\0';
  puVar3[0x75] = '\0';
  puVar3[0x76] = '\0';
  puVar3[0x77] = '\0';
  puVar3[0x78] = '\0';
  puVar3[0x79] = '\0';
  puVar3[0x7a] = '\0';
  puVar3[0x7b] = '\0';
  puVar3[0x7c] = '\0';
  puVar3[0x7d] = '\0';
  puVar3[0x7e] = '\0';
  puVar3[0x7f] = '\0';
  puVar3[0] = '\0';
  puVar3[1] = '\0';
  puVar3[2] = '\0';
  puVar3[3] = '\0';
  puVar3[4] = '\0';
  puVar3[5] = '\0';
  puVar3[6] = '\0';
  puVar3[7] = '\0';
  puVar3[8] = '\0';
  puVar3[9] = '\0';
  puVar3[10] = '\0';
  puVar3[0xb] = '\0';
  puVar3[0xc] = '\0';
  puVar3[0xd] = '\0';
  puVar3[0xe] = '\0';
  puVar3[0xf] = '\0';
  puVar3[0x10] = '\0';
  puVar3[0x11] = '\0';
  puVar3[0x12] = '\0';
  puVar3[0x13] = '\0';
  puVar3[0x14] = '\0';
  puVar3[0x15] = '\0';
  puVar3[0x16] = '\0';
  puVar3[0x17] = '\0';
  puVar3[0x18] = '\0';
  puVar3[0x19] = '\0';
  puVar3[0x1a] = '\0';
  puVar3[0x1b] = '\0';
  puVar3[0x1c] = '\0';
  puVar3[0x1d] = '\0';
  puVar3[0x1e] = '\0';
  puVar3[0x1f] = '\0';
  puVar3[0x20] = '\0';
  puVar3[0x21] = '\0';
  puVar3[0x22] = '\0';
  puVar3[0x23] = '\0';
  puVar3[0x24] = '\0';
  puVar3[0x25] = '\0';
  puVar3[0x26] = '\0';
  puVar3[0x27] = '\0';
  puVar3[0x28] = '\0';
  puVar3[0x29] = '\0';
  puVar3[0x2a] = '\0';
  puVar3[0x2b] = '\0';
  puVar3[0x2c] = '\0';
  puVar3[0x2d] = '\0';
  puVar3[0x2e] = '\0';
  puVar3[0x2f] = '\0';
  puVar3[0x30] = '\0';
  puVar3[0x31] = '\0';
  puVar3[0x32] = '\0';
  puVar3[0x33] = '\0';
  puVar3[0x34] = '\0';
  puVar3[0x35] = '\0';
  puVar3[0x36] = '\0';
  puVar3[0x37] = '\0';
  puVar3[0x38] = '\0';
  puVar3[0x39] = '\0';
  puVar3[0x3a] = '\0';
  puVar3[0x3b] = '\0';
  puVar3[0x3c] = '\0';
  puVar3[0x3d] = '\0';
  puVar3[0x3e] = '\0';
  puVar3[0x3f] = '\0';
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar1 = Unit_Test::intensityValue();
  puVar3[*local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start] = uVar1;
  uVar1 = Unit_Test::intensityValue();
  puVar3[local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[1]] = uVar1;
  (*LookupTable)(&local_60,&local_38,&local_a8);
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(2);
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start
       [*local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start];
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] =
       local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start
       [local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[1]];
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar2 = Unit_Test::verifyImage(&local_60,&local_78,true);
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_60._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_60);
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_38._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_38);
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form1_LookupTable(LookupTableForm1 LookupTable)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = randomImage( intensity );

        std::vector < uint8_t > lookupTable( 256, 0 );

        lookupTable[intensity[0]] = intensityValue();
        lookupTable[intensity[1]] = intensityValue();

        const PenguinV_Image::Image output = LookupTable( input, lookupTable );

        std::vector < uint8_t > normalized( 2 );

        normalized[0] = lookupTable[intensity[0]];
        normalized[1] = lookupTable[intensity[1]];

        return verifyImage( output, normalized );
    }